

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLUtils.cpp
# Opt level: O2

String * __thiscall
Diligent::GetHLSLProfileString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,SHADER_TYPE ShaderType,
          ShaderVersion ShaderModel)

{
  int iVar1;
  uint in_register_00000014;
  string msg;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = (int)this;
  switch(iVar1) {
  case 1:
    break;
  case 2:
    break;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_00325d5b_caseD_3:
    FormatString<char[20]>(&msg,(char (*) [20])"Unknown shader type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetHLSLProfileString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLUtils.cpp"
               ,0x5b);
LAB_00325d95:
    std::__cxx11::string::~string((string *)&msg);
    goto LAB_00325cd8;
  case 4:
    break;
  case 8:
    break;
  default:
    if ((((((iVar1 != 0x10) && (iVar1 != 0x20)) && (iVar1 != 0x40)) &&
         ((iVar1 != 0x80 && (iVar1 != 0x100)))) &&
        ((iVar1 != 0x200 && ((iVar1 != 0x400 && (iVar1 != 0x800)))))) &&
       ((iVar1 != 0x1000 && (iVar1 != 0x2000)))) {
      if (iVar1 != 0x4000) goto switchD_00325d5b_caseD_3;
      FormatString<char[24]>(&msg,(char (*) [24])"Unsupported shader type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetHLSLProfileString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLUtils.cpp"
                 ,0x58);
      goto LAB_00325d95;
    }
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
LAB_00325cd8:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&msg,ShaderType);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&msg,in_register_00000014);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&msg);
  return __return_storage_ptr__;
}

Assistant:

String GetHLSLProfileString(SHADER_TYPE ShaderType, ShaderVersion ShaderModel)
{
    String strShaderProfile;

    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    switch (ShaderType)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           strShaderProfile = "vs"; break;
        case SHADER_TYPE_PIXEL:            strShaderProfile = "ps"; break;
        case SHADER_TYPE_GEOMETRY:         strShaderProfile = "gs"; break;
        case SHADER_TYPE_HULL:             strShaderProfile = "hs"; break;
        case SHADER_TYPE_DOMAIN:           strShaderProfile = "ds"; break;
        case SHADER_TYPE_COMPUTE:          strShaderProfile = "cs"; break;
        case SHADER_TYPE_AMPLIFICATION:    strShaderProfile = "as"; break;
        case SHADER_TYPE_MESH:             strShaderProfile = "ms"; break;
        case SHADER_TYPE_RAY_GEN:
        case SHADER_TYPE_RAY_MISS:
        case SHADER_TYPE_RAY_CLOSEST_HIT:
        case SHADER_TYPE_RAY_ANY_HIT:
        case SHADER_TYPE_RAY_INTERSECTION:
        case SHADER_TYPE_CALLABLE:         strShaderProfile = "lib"; break;
        case SHADER_TYPE_TILE:
            UNSUPPORTED("Unsupported shader type");
            break;
        // clang-format on
        default: UNEXPECTED("Unknown shader type");
    }

    strShaderProfile += "_";
    strShaderProfile += std::to_string(ShaderModel.Major);
    strShaderProfile += "_";
    strShaderProfile += std::to_string(ShaderModel.Minor);

    return strShaderProfile;
}